

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

bool __thiscall
iutest::detail::SizeIsMatcher<unsigned_int>::Check<int,3ul>
          (SizeIsMatcher<unsigned_int> *this,int (*param_1) [3])

{
  unsigned_long local_50;
  EqMatcher<unsigned_int> local_48;
  AssertionResult local_38;
  
  local_48.m_expected = &this->m_expected;
  local_48.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_002262a8;
  local_50 = 3;
  EqMatcher<unsigned_int>::operator()(&local_38,&local_48,&local_50);
  std::__cxx11::string::~string((string *)&local_38);
  return local_38.m_result;
}

Assistant:

bool Check(const U(&)[SIZE])
    {
        return static_cast<bool>(CastToMatcher(m_expected)(SIZE));
    }